

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::StringFieldGenerator::GenerateInlineAccessorDefinitions
          (StringFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  char *text;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "inline const ::std::string& $classname$::$name$() const {\n  return *$name$_;\n}\ninline void $classname$::set_$name$(const ::std::string& value) {\n  set_has_$name$();\n  if ($name$_ == $default_variable$) {\n    $name$_ = new ::std::string;\n  }\n  $name$_->assign(value);\n}\ninline void $classname$::set_$name$(const char* value) {\n  set_has_$name$();\n  if ($name$_ == $default_variable$) {\n    $name$_ = new ::std::string;\n  }\n  $name$_->assign(value);\n}\ninline void $classname$::set_$name$(const $pointer_type$* value, size_t size) {\n  set_has_$name$();\n  if ($name$_ == $default_variable$) {\n    $name$_ = new ::std::string;\n  }\n  $name$_->assign(reinterpret_cast<const char*>(value), size);\n}\ninline ::std::string* $classname$::mutable_$name$() {\n  set_has_$name$();\n  if ($name$_ == $default_variable$) {\n"
                    );
  text = "    $name$_ = new ::std::string(*$default_variable$);\n";
  if (*(long *)(*(long *)(this->descriptor_ + 0x70) + 8) == 0) {
    text = "    $name$_ = new ::std::string;\n";
  }
  io::Printer::Print(printer,variables,text);
  io::Printer::Print(printer,variables,
                     "  }\n  return $name$_;\n}\ninline ::std::string* $classname$::release_$name$() {\n  clear_has_$name$();\n  if ($name$_ == $default_variable$) {\n    return NULL;\n  } else {\n    ::std::string* temp = $name$_;\n    $name$_ = const_cast< ::std::string*>($default_variable$);\n    return temp;\n  }\n}\ninline void $classname$::set_allocated_$name$(::std::string* $name$) {\n  if ($name$_ != $default_variable$) {\n    delete $name$_;\n  }\n  if ($name$) {\n    set_has_$name$();\n    $name$_ = $name$;\n  } else {\n    clear_has_$name$();\n    $name$_ = const_cast< ::std::string*>($default_variable$);\n  }\n}\n"
                    );
  return;
}

Assistant:

void StringFieldGenerator::
GenerateInlineAccessorDefinitions(io::Printer* printer) const {
  printer->Print(variables_,
    "inline const ::std::string& $classname$::$name$() const {\n"
    "  return *$name$_;\n"
    "}\n"
    "inline void $classname$::set_$name$(const ::std::string& value) {\n"
    "  set_has_$name$();\n"
    "  if ($name$_ == $default_variable$) {\n"
    "    $name$_ = new ::std::string;\n"
    "  }\n"
    "  $name$_->assign(value);\n"
    "}\n"
    "inline void $classname$::set_$name$(const char* value) {\n"
    "  set_has_$name$();\n"
    "  if ($name$_ == $default_variable$) {\n"
    "    $name$_ = new ::std::string;\n"
    "  }\n"
    "  $name$_->assign(value);\n"
    "}\n"
    "inline "
    "void $classname$::set_$name$(const $pointer_type$* value, size_t size) {\n"
    "  set_has_$name$();\n"
    "  if ($name$_ == $default_variable$) {\n"
    "    $name$_ = new ::std::string;\n"
    "  }\n"
    "  $name$_->assign(reinterpret_cast<const char*>(value), size);\n"
    "}\n"
    "inline ::std::string* $classname$::mutable_$name$() {\n"
    "  set_has_$name$();\n"
    "  if ($name$_ == $default_variable$) {\n");
  if (descriptor_->default_value_string().empty()) {
    printer->Print(variables_,
      "    $name$_ = new ::std::string;\n");
  } else {
    printer->Print(variables_,
      "    $name$_ = new ::std::string(*$default_variable$);\n");
  }
  printer->Print(variables_,
    "  }\n"
    "  return $name$_;\n"
    "}\n"
    "inline ::std::string* $classname$::release_$name$() {\n"
    "  clear_has_$name$();\n"
    "  if ($name$_ == $default_variable$) {\n"
    "    return NULL;\n"
    "  } else {\n"
    "    ::std::string* temp = $name$_;\n"
    "    $name$_ = const_cast< ::std::string*>($default_variable$);\n"
    "    return temp;\n"
    "  }\n"
    "}\n"
    "inline void $classname$::set_allocated_$name$(::std::string* $name$) {\n"
    "  if ($name$_ != $default_variable$) {\n"
    "    delete $name$_;\n"
    "  }\n"
    "  if ($name$) {\n"
    "    set_has_$name$();\n"
    "    $name$_ = $name$;\n"
    "  } else {\n"
    "    clear_has_$name$();\n"
    "    $name$_ = const_cast< ::std::string*>($default_variable$);\n"
    "  }\n"
    "}\n");
}